

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-connect.c
# Opt level: O0

int run_test_udp_connect(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_buf_t uVar3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  size_t local_180;
  int local_178;
  int local_174;
  int addrlen;
  int r;
  sockaddr_in tmp_addr;
  sockaddr_in ext_addr;
  uv_udp_send_t req;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&lo_addr);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0x6f,"0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &lo_addr)");
    abort();
  }
  puVar2 = uv_default_loop();
  local_174 = uv_udp_init(puVar2,&server);
  if (local_174 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0x72,"r == 0");
    abort();
  }
  local_174 = uv_udp_bind(&server,(sockaddr *)&lo_addr,0);
  if (local_174 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0x75,"r == 0");
    abort();
  }
  local_174 = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
  if (local_174 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0x78,"r == 0");
    abort();
  }
  puVar2 = uv_default_loop();
  local_174 = uv_udp_init(puVar2,&client);
  if (local_174 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0x7b,"r == 0");
    abort();
  }
  uVar3 = uv_buf_init("EXIT",4);
  eval_a = (int64_t)uVar3.base;
  buf.base = (char *)eval_a;
  local_180 = uVar3.len;
  buf.len = local_180;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)&addrlen);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0x80,"0","==","uv_ip4_addr(\"0.0.0.0\", 9123, &tmp_addr)",0,"==",(long)iVar1);
    abort();
  }
  local_174 = uv_udp_connect(&client,(sockaddr *)&addrlen);
  if ((long)local_174 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0x85,"r","==","0",(long)local_174,"==",0);
    abort();
  }
  local_174 = uv_udp_connect(&client,(sockaddr *)0x0);
  if ((long)local_174 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0x87,"r","==","0",(long)local_174,"==",0);
    abort();
  }
  iVar1 = uv_ip4_addr("8.8.8.8",0x23a3,(sockaddr_in *)tmp_addr.sin_zero);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0x8a,"0 == uv_ip4_addr(\"8.8.8.8\", TEST_PORT, &ext_addr)");
    abort();
  }
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&lo_addr);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0x8b,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &lo_addr)");
    abort();
  }
  local_174 = uv_udp_connect(&client,(sockaddr *)&lo_addr);
  if (local_174 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0x8e,"r == 0");
    abort();
  }
  local_174 = uv_udp_connect(&client,(sockaddr *)tmp_addr.sin_zero);
  if (local_174 != -0x6a) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0x90,"r == UV_EISCONN");
    abort();
  }
  local_178 = 0x10;
  local_174 = uv_udp_getpeername(&client,(sockaddr *)&addrlen,&local_178);
  if (local_174 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0x94,"r == 0");
    abort();
  }
  local_174 = uv_udp_try_send(&client,&buf,1,(sockaddr *)&lo_addr);
  if (local_174 != -0x6a) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0x98,"r == UV_EISCONN");
    abort();
  }
  local_174 = uv_udp_try_send(&client,&buf,1,(sockaddr *)0x0);
  if (local_174 != 4) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0x9a,"r == 4");
    abort();
  }
  local_174 = uv_udp_try_send(&client,&buf,1,(sockaddr *)tmp_addr.sin_zero);
  if (local_174 != -0x6a) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0x9c,"r == UV_EISCONN");
    abort();
  }
  local_174 = uv_udp_connect(&client,(sockaddr *)0x0);
  if (local_174 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0x9f,"r == 0");
    abort();
  }
  local_174 = uv_udp_connect(&client,(sockaddr *)0x0);
  if (local_174 != -0x6b) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0xa1,"r == UV_ENOTCONN");
    abort();
  }
  local_178 = 0x10;
  local_174 = uv_udp_getpeername(&client,(sockaddr *)&addrlen,&local_178);
  if (local_174 != -0x6b) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0xa5,"r == UV_ENOTCONN");
    abort();
  }
  local_174 = uv_udp_try_send(&client,&buf,1,(sockaddr *)&lo_addr);
  if (local_174 != 4) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0xa9,"r == 4");
    abort();
  }
  local_174 = uv_udp_try_send(&client,&buf,1,(sockaddr *)0x0);
  if (local_174 != -0x59) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0xab,"r == UV_EDESTADDRREQ");
    abort();
  }
  local_174 = uv_udp_connect(&client,(sockaddr *)&lo_addr);
  if (local_174 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0xaf,"r == 0");
    abort();
  }
  local_174 = uv_udp_send((uv_udp_send_t *)ext_addr.sin_zero,&client,&buf,1,(sockaddr *)&lo_addr,
                          cl_send_cb);
  if (local_174 != -0x6a) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0xb6,"r == UV_EISCONN");
    abort();
  }
  local_174 = uv_udp_send((uv_udp_send_t *)ext_addr.sin_zero,&client,&buf,1,(sockaddr *)0x0,
                          cl_send_cb);
  if (local_174 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0xb8,"r == 0");
    abort();
  }
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  if (close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0xbc,"close_cb_called == 2");
    abort();
  }
  if (sv_recv_cb_called != 4) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0xbd,"sv_recv_cb_called == 4");
    abort();
  }
  if (cl_send_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0xbe,"cl_send_cb_called == 2");
    abort();
  }
  if (client.send_queue_size != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0xc0,"client.send_queue_size == 0");
    abort();
  }
  if (server.send_queue_size != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0xc1,"server.send_queue_size == 0");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-connect.c"
            ,0xc3,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(udp_connect) {
#if defined(__PASE__)
  RETURN_SKIP(
      "IBMi PASE's UDP connection can not be disconnected with AF_UNSPEC.");
#endif
  uv_udp_send_t req;
  struct sockaddr_in ext_addr;
  struct sockaddr_in tmp_addr;
  int r;
  int addrlen;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &lo_addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_bind(&server, (const struct sockaddr*) &lo_addr, 0);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&server, alloc_cb, sv_recv_cb);
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  buf = uv_buf_init("EXIT", 4);

  /* connect() to INADDR_ANY fails on Windows wih WSAEADDRNOTAVAIL */
  ASSERT_EQ(0, uv_ip4_addr("0.0.0.0", TEST_PORT, &tmp_addr));
  r = uv_udp_connect(&client, (const struct sockaddr*) &tmp_addr);
#ifdef _WIN32
  ASSERT_EQ(r, UV_EADDRNOTAVAIL);
#else
  ASSERT_EQ(r, 0);
  r = uv_udp_connect(&client, NULL);
  ASSERT_EQ(r, 0);
#endif

  ASSERT(0 == uv_ip4_addr("8.8.8.8", TEST_PORT, &ext_addr));
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &lo_addr));

  r = uv_udp_connect(&client, (const struct sockaddr*) &lo_addr);
  ASSERT(r == 0);
  r = uv_udp_connect(&client, (const struct sockaddr*) &ext_addr);
  ASSERT(r == UV_EISCONN);

  addrlen = sizeof(tmp_addr);
  r = uv_udp_getpeername(&client, (struct sockaddr*) &tmp_addr, &addrlen);
  ASSERT(r == 0);

  /* To send messages in connected UDP sockets addr must be NULL */
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &lo_addr);
  ASSERT(r == UV_EISCONN);
  r = uv_udp_try_send(&client, &buf, 1, NULL);
  ASSERT(r == 4);
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &ext_addr);
  ASSERT(r == UV_EISCONN);

  r = uv_udp_connect(&client, NULL);
  ASSERT(r == 0);
  r = uv_udp_connect(&client, NULL);
  ASSERT(r == UV_ENOTCONN);

  addrlen = sizeof(tmp_addr);
  r = uv_udp_getpeername(&client, (struct sockaddr*) &tmp_addr, &addrlen);
  ASSERT(r == UV_ENOTCONN);

  /* To send messages in disconnected UDP sockets addr must be set */
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &lo_addr);
  ASSERT(r == 4);
  r = uv_udp_try_send(&client, &buf, 1, NULL);
  ASSERT(r == UV_EDESTADDRREQ);


  r = uv_udp_connect(&client, (const struct sockaddr*) &lo_addr);
  ASSERT(r == 0);
  r = uv_udp_send(&req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &lo_addr,
                  cl_send_cb);
  ASSERT(r == UV_EISCONN);
  r = uv_udp_send(&req, &client, &buf, 1, NULL, cl_send_cb);
  ASSERT(r == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 2);
  ASSERT(sv_recv_cb_called == 4);
  ASSERT(cl_send_cb_called == 2);

  ASSERT(client.send_queue_size == 0);
  ASSERT(server.send_queue_size == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}